

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  order_book ob;
  string local_120;
  order_book local_100;
  
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"AXP","");
  helix::order_book::order_book(&local_100,&local_120,0,20000000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  test_add(&local_100,20000000);
  test_cancel(&local_100,20000000);
  test_remove(&local_100,20000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"order_book::add()    ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ns/op",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"order_book::cancel() ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ns/op",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"order_book::remove() ",0x15);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ns/op",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  ::~_Rb_tree(&local_100._asks._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_helix::price_level>,_std::_Select1st<std::pair<const_unsigned_long,_helix::price_level>_>,_std::greater<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::price_level>_>_>
  ::~_Rb_tree(&local_100._bids._M_t);
  boost::multi_index::
  multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>
  ::~multi_index_container(&local_100._orders);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._symbol._M_dataplus._M_p != &local_100._symbol.field_2) {
    operator_delete(local_100._symbol._M_dataplus._M_p,
                    local_100._symbol.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main()
{
    unsigned long count = 20000000;

    order_book ob{"AXP", 0, count};
    auto add_duration = test_add(ob, count);
    auto cancel_duration = test_cancel(ob, count);
    auto remove_duration = test_remove(ob, count);

    std::cout << "order_book::add()    " << std::chrono::duration_cast<std::chrono::nanoseconds>(add_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::cancel() " << std::chrono::duration_cast<std::chrono::nanoseconds>(cancel_duration).count() / count << " ns/op" << std::endl;
    std::cout << "order_book::remove() " << std::chrono::duration_cast<std::chrono::nanoseconds>(remove_duration).count() / count << " ns/op" << std::endl;
}